

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,PromiseNetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  SourceLocation location;
  StringPtr url_00;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *headers_00;
  HttpMethod method_00;
  NetworkAddressHttpClient *this_00;
  String *pSVar1;
  HttpHeaders *pHVar2;
  TypeByIndex<0UL,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
  *t;
  Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *pPVar3;
  TypeByIndex<1UL,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
  *t_00;
  Promise<kj::HttpClient::Response> *pPVar4;
  int __flags;
  PromiseNetworkAddressHttpClient *pPVar5;
  StringPtr *params;
  void *__child_stack;
  char *__arg;
  Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> local_1d0 [2];
  SourceLocation local_1c0;
  undefined1 local_1a8 [8];
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  Maybe<unsigned_long> local_188;
  String local_178;
  HttpHeaders local_160;
  undefined1 local_100 [16];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6219:11),_void>
  combined;
  HttpHeaders headersCopy;
  String urlCopy;
  Maybe<unsigned_long> local_68;
  PromiseNetworkAddressHttpClient *local_58;
  char *pcStack_50;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *local_48;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *c;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *_c6212;
  HttpHeaders *headers_local;
  PromiseNetworkAddressHttpClient *pPStack_28;
  HttpMethod method_local;
  PromiseNetworkAddressHttpClient *this_local;
  StringPtr url_local;
  
  __arg = (char *)url.content.size_;
  pPVar5 = (PromiseNetworkAddressHttpClient *)url.content.ptr;
  _c6212 = (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)headers;
  headers_local._4_4_ = method;
  pPStack_28 = this;
  this_local = pPVar5;
  url_local.content.ptr = __arg;
  url_local.content.size_ = (size_t)__return_storage_ptr__;
  local_48 = kj::_::readMaybe<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>
                       (&this->client);
  __flags = (int)pPVar5;
  c = local_48;
  if (local_48 == (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)0x0) {
    str<kj::StringPtr&>((String *)&headersCopy.ownedStrings.builder.disposer,(kj *)&this_local,
                        params);
    HttpHeaders::clone((HttpHeaders *)&combined,(__fn *)_c6212,__child_stack,__flags,__arg);
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_100);
    split.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr =
         (Promise<kj::HttpClient::Response>)(Promise<kj::HttpClient::Response>)this;
    Maybe<unsigned_long>::Maybe(&local_188,expectedBodySize);
    pSVar1 = mv<kj::String>((String *)&headersCopy.ownedStrings.builder.disposer);
    String::String(&local_178,pSVar1);
    pHVar2 = mv<kj::HttpHeaders>((HttpHeaders *)&combined);
    HttpHeaders::HttpHeaders(&local_160,pHVar2);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_>
              ((Promise<void> *)(local_100 + 8),(Type *)local_100);
    kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::
    request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
    {lambda()#1}::~Maybe
              ((_lambda___1_ *)
               &split.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>);
    Promise<void>::~Promise((Promise<void> *)local_100);
    SourceLocation::SourceLocation
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"request",0x1851,0x14);
    location.function = local_1c0.function;
    location.fileName = local_1c0.fileName;
    location.lineNumber = local_1c0.lineNumber;
    location.columnNumber = local_1c0.columnNumber;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)local_1a8,location);
    t = get<0ul,kj::_::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>,kj::Promise<kj::HttpClient::Response>>&>
                  ((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
                    *)local_1a8);
    pPVar3 = mv<kj::Promise<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>>(t);
    Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>::Promise(local_1d0,pPVar3);
    newPromisedStream((kj *)__return_storage_ptr__,local_1d0);
    t_00 = get<1ul,kj::_::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>,kj::Promise<kj::HttpClient::Response>>&>
                     ((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
                       *)local_1a8);
    pPVar4 = mv<kj::Promise<kj::HttpClient::Response>>(t_00);
    Promise<kj::HttpClient::Response>::Promise(&__return_storage_ptr__->response,pPVar4);
    Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>::~Promise(local_1d0);
    kj::_::
    Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
    ::~Tuple((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_>,_kj::Promise<kj::HttpClient::Response>_>
              *)local_1a8);
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::~Promise((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
                *)(local_100 + 8));
    HttpHeaders::~HttpHeaders((HttpHeaders *)&combined);
    String::~String((String *)&headersCopy.ownedStrings.builder.disposer);
  }
  else {
    this_00 = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>::operator->
                        (local_48);
    method_00 = headers_local._4_4_;
    headers_00 = _c6212;
    local_58 = this_local;
    pcStack_50 = url_local.content.ptr;
    Maybe<unsigned_long>::Maybe(&local_68,expectedBodySize);
    url_00.content.size_ = (size_t)pcStack_50;
    url_00.content.ptr = (char *)local_58;
    NetworkAddressHttpClient::request
              (__return_storage_ptr__,this_00,method_00,url_00,(HttpHeaders *)headers_00,&local_68);
    Maybe<unsigned_long>::~Maybe(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_SOME(c, client) {
      return c->request(method, url, headers, expectedBodySize);
    }